

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CS248::Application::toggle_create_joint_action(Application *this)

{
  bool bVar1;
  
  bVar1 = this->action == CreateJoint;
  this->action = (uint)bVar1 * 4 + CreateJoint;
  setGhosted(this,!bVar1);
  return;
}

Assistant:

void Application::toggle_create_joint_action() {
  if (action != Action::CreateJoint) {
    action = Action::CreateJoint;
    setGhosted(true);
  } else {
    action = Action::Object;
    setGhosted(false);
  }
}